

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O2

DdNode * Kit_TruthToBdd_rec(DdManager *dd,uint *pTruth,int iBit,int nVars,int nVarsTotal,
                           int fMSBonTop)

{
  int iVar1;
  uint uVar2;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  uint uVar3;
  int nVars_00;
  
  if (nVars < 6) {
    uVar3 = 0xffffffff >> ((byte)(-1 << ((byte)nVars & 0x1f)) & 0x1f);
    uVar2 = pTruth[iBit >> 5] >> ((byte)iBit & 0x1f) & uVar3;
    if (uVar2 == 0) {
      return (DdNode *)((ulong)dd->one ^ 1);
    }
    if (uVar2 == uVar3) {
      return dd->one;
    }
  }
  nVars_00 = nVars + -1;
  iVar1 = nVarsTotal - nVars;
  if (fMSBonTop == 0) {
    iVar1 = nVars_00;
  }
  n = Kit_TruthToBdd_rec(dd,pTruth,iBit,nVars_00,nVarsTotal,fMSBonTop);
  Cudd_Ref(n);
  n_00 = Kit_TruthToBdd_rec(dd,pTruth,(1 << ((byte)nVars_00 & 0x1f)) + iBit,nVars_00,nVarsTotal,
                            fMSBonTop);
  Cudd_Ref(n_00);
  n_01 = Cudd_bddIte(dd,dd->vars[iVar1],n_00,n);
  Cudd_Ref(n_01);
  Cudd_RecursiveDeref(dd,n);
  Cudd_RecursiveDeref(dd,n_00);
  Cudd_Deref(n_01);
  return n_01;
}

Assistant:

DdNode * Kit_TruthToBdd_rec( DdManager * dd, unsigned * pTruth, int iBit, int nVars, int nVarsTotal, int fMSBonTop )
{
    DdNode * bF0, * bF1, * bF;
    int Var;
    if ( nVars <= 5 )
    {
        unsigned uTruth, uMask;
        uMask = ((~(unsigned)0) >> (32 - (1<<nVars)));
        uTruth = (pTruth[iBit>>5] >> (iBit&31)) & uMask;
        if ( uTruth == 0 )
            return b0;
        if ( uTruth == uMask )
            return b1;        
    }
    // find the variable to use
    Var = fMSBonTop? nVarsTotal-nVars : nVars-1;
    // other special cases can be added
    bF0 = Kit_TruthToBdd_rec( dd, pTruth, iBit,                nVars-1, nVarsTotal, fMSBonTop );  Cudd_Ref( bF0 );
    bF1 = Kit_TruthToBdd_rec( dd, pTruth, iBit+(1<<(nVars-1)), nVars-1, nVarsTotal, fMSBonTop );  Cudd_Ref( bF1 );
    bF  = Cudd_bddIte( dd, dd->vars[Var], bF1, bF0 );                     Cudd_Ref( bF );
    Cudd_RecursiveDeref( dd, bF0 );
    Cudd_RecursiveDeref( dd, bF1 );
    Cudd_Deref( bF );
    return bF;
}